

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

ImFont ** __thiscall ImVector<ImFont_*>::erase_unsorted(ImVector<ImFont_*> *this,ImFont **it)

{
  ImFont **ppIVar1;
  ImFont **ppIVar2;
  int iVar3;
  long lVar4;
  
  ppIVar2 = this->Data;
  if (ppIVar2 <= it) {
    iVar3 = this->Size;
    ppIVar1 = ppIVar2 + iVar3;
    if (it < ppIVar1) {
      lVar4 = (long)it - (long)ppIVar2;
      if (it < ppIVar1 + -1) {
        *(ImFont **)((long)ppIVar2 + lVar4) = ppIVar1[-1];
        iVar3 = this->Size;
        ppIVar2 = this->Data;
      }
      this->Size = iVar3 + -1;
      return (ImFont **)((long)ppIVar2 + lVar4);
    }
  }
  __assert_fail("it >= Data && it < Data+Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                ,0x4f1,"T *ImVector<ImFont *>::erase_unsorted(const T *) [T = ImFont *]");
}

Assistant:

inline T*           erase_unsorted(const T* it)         { IM_ASSERT(it >= Data && it < Data+Size);  const ptrdiff_t off = it - Data; if (it < Data+Size-1) memcpy(Data + off, Data + Size - 1, sizeof(T)); Size--; return Data + off; }